

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O3

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* PolynomialGenerateCombinations
            (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec_in)

{
  vector<unsigned_long,std::allocator<unsigned_long>> *this;
  iterator __position;
  long lVar1;
  long lVar2;
  unsigned_long *__args;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  allocator_type local_51;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_50;
  pointer local_48;
  pointer local_40;
  ulong local_38;
  
  lVar1 = (long)(vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar2 = lVar1 >> 3;
  auVar6._8_4_ = (int)(lVar1 >> 0x23);
  auVar6._0_8_ = lVar2;
  auVar6._12_4_ = 0x45300000;
  dVar5 = exp2((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
  uVar3 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
  local_40 = (vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_48 = (vec_in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_50 = __return_storage_ptr__;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(__return_storage_ptr__,uVar3,&local_51);
  if (uVar3 != 0) {
    lVar1 = (long)local_48 - (long)local_40 >> 3;
    uVar4 = 0;
    local_38 = uVar3;
    do {
      if (local_48 != local_40) {
        lVar2 = 0;
        uVar3 = 0;
        do {
          if ((uVar4 >> (uVar3 & 0x3f) & 1) != 0) {
            this = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                   ((local_50->
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar4);
            __args = (unsigned_long *)
                     ((long)(vec_in->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar2);
            __position._M_current = *(unsigned_long **)(this + 8);
            if (__position._M_current == *(unsigned_long **)(this + 0x10)) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>(this,__position,__args);
            }
            else {
              *__position._M_current = *__args;
              *(unsigned_long **)(this + 8) = __position._M_current + 1;
            }
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 8;
        } while (lVar1 + (ulong)(lVar1 == 0) != uVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_38);
  }
  return local_50;
}

Assistant:

std::vector<std::vector<openjij::graph::Index>> PolynomialGenerateCombinations(const std::vector<openjij::graph::Index> &vec_in) {
   const std::size_t loop = static_cast<std::size_t>(std::pow(2, vec_in.size()));
   const std::size_t num  = vec_in.size();
   std::vector<std::vector<openjij::graph::Index>> vec_out(loop);
   for (std::size_t i = 0; i < loop; ++i) {
      std::bitset<64> bs(i);
      for (std::size_t j = 0; j < num; ++j) {
         if (bs[j]) {
            vec_out[i].push_back(vec_in[j]);
         }
      }
   }
   return vec_out;
}